

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check.h
# Opt level: O2

optional<long> *
inline_assertion_check<true,std::optional<long>const&>
          (optional<long> *val,char *file,int line,char *func,char *assertion)

{
  long lVar1;
  string_view assertion_00;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  long in_FS_OFFSET;
  string_view file_00;
  string_view func_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((val->super__Optional_base<long,_true,_true>)._M_payload.super__Optional_payload_base<long>.
      _M_engaged == false) {
    sVar2 = strlen(file);
    sVar3 = strlen(func);
    sVar4 = strlen(assertion);
    assertion_00._M_str = assertion;
    assertion_00._M_len = sVar4;
    file_00._M_str = file;
    file_00._M_len = sVar2;
    func_00._M_str = func;
    func_00._M_len = sVar3;
    assertion_fail(file_00,line,func_00,assertion_00);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return val;
  }
  __stack_chk_fail();
}

Assistant:

T&& inline_assertion_check(LIFETIMEBOUND T&& val, [[maybe_unused]] const char* file, [[maybe_unused]] int line, [[maybe_unused]] const char* func, [[maybe_unused]] const char* assertion)
{
    if constexpr (IS_ASSERT
#ifdef ABORT_ON_FAILED_ASSUME
                  || true
#endif
    ) {
        if (!val) {
            assertion_fail(file, line, func, assertion);
        }
    }
    return std::forward<T>(val);
}